

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int lws_cache_nscookiejar_write
              (lws_cache_ttl_lru *_c,char *specific_key,uint8_t *source,size_t size,
              lws_usec_t expiry,void **ppvoid)

{
  int iVar1;
  int iVar2;
  char tag [128];
  char acStack_a8 [128];
  
  _lws_log(0x10,"%s: %s: len %d\n","lws_cache_nscookiejar_write",(_c->info).name);
  if (source != (uint8_t *)0x0) {
    iVar1 = nsc_line_to_tag((char *)source,size,acStack_a8,0x80,(lws_usec_t *)0x0);
    iVar2 = 1;
    if (iVar1 == 0) {
      if (ppvoid != (void **)0x0) {
        *ppvoid = (void *)0x0;
      }
      iVar1 = nsc_regen((lws_cache_nscookiejar_t *)_c,acStack_a8,source,size);
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = 1;
        _lws_log(1,"%s: regen failed\n","lws_cache_nscookiejar_write");
      }
    }
    return iVar2;
  }
  __assert_fail("source",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/file.c"
                ,0x2c6,
                "int lws_cache_nscookiejar_write(struct lws_cache_ttl_lru *, const char *, const uint8_t *, size_t, lws_usec_t, void **)"
               );
}

Assistant:

static int
lws_cache_nscookiejar_write(struct lws_cache_ttl_lru *_c,
			    const char *specific_key, const uint8_t *source,
			    size_t size, lws_usec_t expiry, void **ppvoid)
{
	lws_cache_nscookiejar_t *cache = (lws_cache_nscookiejar_t *)_c;
	char tag[128];

	lwsl_cache("%s: %s: len %d\n", __func__, _c->info.name, (int)size);

	assert(source);

	if (nsc_line_to_tag((const char *)source, size, tag, sizeof(tag), NULL))
		return 1;

	if (ppvoid)
		*ppvoid = NULL;

	if (nsc_regen(cache, tag, source, size)) {
		lwsl_err("%s: regen failed\n", __func__);

		return 1;
	}

	return 0;
}